

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_tests.cpp
# Opt level: O3

void __thiscall PerformanceTest::long_test(PerformanceTest *this)

{
  long lVar1;
  time_t tVar2;
  ostream *poVar3;
  int iVar4;
  uint64_t key;
  ofstream os;
  string local_260;
  time_t local_240;
  KVStore *local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  key = 0;
  lVar1 = time((time_t *)0x0);
  std::ofstream::ofstream(&local_230,"long_test.txt",_S_out);
  local_238 = &(this->super_Test).store;
  iVar4 = 0;
  local_240 = lVar1;
  do {
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_260,'\x10');
    KVStore::put(local_238,key,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    iVar4 = iVar4 + 1;
    tVar2 = time((time_t *)0x0);
    if (tVar2 - lVar1 == 1) {
      poVar3 = std::ostream::_M_insert<long>((long)&local_230);
      local_260._M_dataplus._M_p._0_1_ = 0x20;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_260,1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar4);
      local_260._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_260,1);
      iVar4 = 0;
      lVar1 = tVar2;
    }
    key = key + 1;
  } while (key != 10000000);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __M_split_cmpts;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void long_test() {
        auto max = 10000000;
        auto put_ps = 0;
        auto start_time = time(nullptr);
        auto cur_time = start_time;
        auto new_time = start_time;
        auto os = std::ofstream{"long_test.txt"};
        for (int i = 0; i < max; i++) {
            store.put(i, std::string(10000, 's'));
            put_ps++;
            new_time = time(nullptr);
            if (new_time - cur_time == 1) {
                os << new_time - start_time << ' ' << put_ps << '\n';
                put_ps = 0;
                cur_time = new_time;
            }
        }
    }